

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::check_crfile
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  pointer p_Var1;
  char cVar2;
  pointer pCVar3;
  pointer pcVar4;
  char *pcVar5;
  pointer p_Var6;
  pointer p_Var7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var11;
  char *pcVar12;
  byte bVar13;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var14;
  bool *pbVar15;
  pointer p_Var16;
  pointer p_Var17;
  CharCount CVar18;
  char *pcVar19;
  ulong uVar20;
  
  sVar10 = path_distance<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                     ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  this->crfile_path_distance_ = sVar10;
  bVar13 = sVar10 != 0 | this->match_crfile_;
  if (bVar13 == 1) {
    _Var11._M_current =
         (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    _Var14._M_current =
         (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((_Var11._M_current != _Var14._M_current) && (_Var14._M_current[-1] == '/')) {
      _Var14._M_current = _Var14._M_current + -1;
    }
    _Var11 = path_basename<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                       (_Var11,_Var14);
    (this->item_basename_)._M_current = _Var11._M_current;
    pCVar3 = (this->props_).
             super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar5 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (_Var11._M_current != pcVar5) {
      pbVar15 = &pCVar3[(long)_Var11._M_current - (long)pcVar4].alphanumeric;
      _Var14 = _Var11;
      do {
        cVar2 = *_Var14._M_current;
        *pbVar15 = (byte)(cVar2 + 0xbfU) < 0x1a ||
                   ((byte)(cVar2 + 0x9fU) < 0x1a || (byte)(cVar2 - 0x30U) < 10);
        _Var14._M_current = _Var14._M_current + 1;
        pbVar15 = pbVar15 + 3;
      } while (_Var14._M_current != pcVar5);
    }
    p_Var6 = (this->crfile_basename_word_ends_).
             super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var7 = (this->crfile_basename_word_ends_).
             super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var6 == p_Var7) {
      CVar18 = 0;
    }
    else {
      pcVar8 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar9 = (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar19 = (this->crfile_basename_)._M_current;
      p_Var17 = p_Var6;
      if (pcVar9 != pcVar19 && pcVar8 != _Var11._M_current) {
        pbVar15 = &pCVar3[(long)(_Var11._M_current + (1 - (long)pcVar4))].alphanumeric;
        pcVar12 = _Var11._M_current + 1;
        uVar20 = (long)pcVar12 - (long)pcVar4;
        p_Var16 = p_Var6;
        while (p_Var17 = p_Var16, pcVar12[-1] == *pcVar19) {
          if ((pcVar19 == p_Var16->_M_current) &&
             (p_Var1 = p_Var16 + 1, p_Var17 = p_Var1, p_Var1 == p_Var7)) {
            if ((uVar20 < (ulong)((long)pcVar8 - (long)pcVar4)) &&
               ((((CharProperties *)(pbVar15 + -1))->uppercase == false &&
                (p_Var17 = p_Var16, *pbVar15 == false)))) {
              p_Var17 = p_Var1;
            }
            break;
          }
          if (pcVar12 == pcVar8) break;
          pcVar19 = pcVar19 + 1;
          pbVar15 = pbVar15 + 3;
          uVar20 = uVar20 + 1;
          pcVar12 = pcVar12 + 1;
          p_Var16 = p_Var17;
          if (pcVar19 == pcVar9) break;
        }
      }
      CVar18 = (long)p_Var17 - (long)p_Var6 >> 3;
    }
    this->crfile_basename_shared_words_ = CVar18;
    this->unmatched_suffix_len_ = (long)pcVar5 - (long)(this->item_basename_)._M_current;
  }
  return (bool)bVar13;
}

Assistant:

bool check_crfile() {
    crfile_path_distance_ = path_distance<PathTraits>(
        item_.cbegin(), item_.cend(), crfile_.cbegin(), crfile_.cend());
    if (!match_crfile_ && crfile_path_distance_ == 0) {
      return false;
    }
    // If the last character in the item is a path separator, skip it for the
    // purposes of determining the item basename to be consistent with
    // `consume_path_component_match_front`.
    if (!item_.empty() && PathTraits::is_path_separator(item_.back())) {
      item_basename_ =
          path_basename<PathTraits>(item_.cbegin(), item_.cend() - 1);
    } else {
      item_basename_ = path_basename<PathTraits>(item_.cbegin(), item_.cend());
    }
    auto props_it = props_.begin() + (item_basename_ - item_.cbegin());
    for (auto item_it = item_basename_, item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->alphanumeric = StringTraits::is_alphanumeric(*item_it);
    }
    crfile_basename_shared_words_ = [this]() -> CharCount {
      auto crfile_word_end_it = crfile_basename_word_ends_.cbegin();
      auto const crfile_word_end_last = crfile_basename_word_ends_.cend();
      if (crfile_word_end_it == crfile_word_end_last) {
        return 0;
      }
      for (auto item_it = item_basename_, item_last = item_.cend(),
                crfile_it = crfile_basename_, crfile_last = crfile_.cend();
           item_it != item_last && crfile_it != crfile_last &&
               *item_it == *crfile_it;
           ++item_it, ++crfile_it) {
        if (crfile_it == *crfile_word_end_it) {
          ++crfile_word_end_it;
          if (crfile_word_end_it == crfile_word_end_last) {
            // Only counts if the next character is plausibly not the
            // continuation of a word.
            std::size_t const i = item_it - item_.cbegin();
            if ((i + 1 < item_.size()) && !props_[i + 1].uppercase &&
                props_[i + 1].alphanumeric) {
              --crfile_word_end_it;
            }
            break;
          }
        }
      }
      return crfile_word_end_it - crfile_basename_word_ends_.cbegin();
    }();
    // Ensure that `unmatched_suffix_len_` is initialized even for empty
    // queries.
    unmatched_suffix_len_ = item_.cend() - item_basename_;
    return true;
  }